

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O1

int __thiscall cinemo::LameWrapper::init(LameWrapper *this,EVP_PKEY_CTX *ctx)

{
  WaveHeader *__ptr;
  pointer in_RAX;
  WaveHeader *pWVar1;
  
  if (this->initDone == false) {
    pWVar1 = wh::parseWaveHeader(&this->path);
    __ptr = (this->wh)._M_t.
            super___uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>
            ._M_t.
            super__Tuple_impl<0UL,_cinemo::wh::WaveHeader_*,_std::default_delete<cinemo::wh::WaveHeader>_>
            .super__Head_base<0UL,_cinemo::wh::WaveHeader_*,_false>._M_head_impl;
    (this->wh)._M_t.
    super___uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>._M_t
    .super__Tuple_impl<0UL,_cinemo::wh::WaveHeader_*,_std::default_delete<cinemo::wh::WaveHeader>_>.
    super__Head_base<0UL,_cinemo::wh::WaveHeader_*,_false>._M_head_impl = pWVar1;
    if (__ptr != (WaveHeader *)0x0) {
      std::default_delete<cinemo::wh::WaveHeader>::operator()
                ((default_delete<cinemo::wh::WaveHeader> *)&this->wh,__ptr);
    }
    (this->message_buffer)._M_string_length = 0;
    in_RAX = (this->message_buffer)._M_dataplus._M_p;
    *in_RAX = '\0';
    this->initDone = true;
  }
  return (int)in_RAX;
}

Assistant:

void LameWrapper::init() {
		if (!initDone) {
			wh.reset(std::move(wh::parseWaveHeader(path)));
			message_buffer.clear();
			initDone = true;
		}
    }